

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

complex<long_double> *
TPZMatrix<std::complex<long_double>_>::ReturnNearestValue
          (complex<long_double> *__return_storage_ptr__,complex<long_double> val,
          TPZVec<std::complex<long_double>_> *Vec,complex<long_double> tol)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  undefined2 uVar10;
  complex<long_double> *pcVar11;
  int64_t i;
  long lVar12;
  TPZVec<std::complex<long_double>_> *__z;
  long lVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble lVar16;
  longdouble lVar17;
  longdouble in_ST2;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  complex<long_double> diff0;
  undefined8 local_88;
  undefined2 uStack_80;
  undefined4 uStack_7e;
  undefined2 uStack_7a;
  undefined8 local_78;
  undefined2 uStack_70;
  undefined4 uStack_6e;
  undefined2 uStack_6a;
  complex<long_double> local_68;
  longdouble local_48;
  longdouble local_3c;
  
  lVar17 = val._M_value._0_10_;
  uStack_7a = val._M_value._14_2_;
  uStack_7e = val._M_value._10_4_;
  lVar18 = val._M_value._16_10_;
  uStack_6e = val._M_value._26_4_;
  uStack_6a = val._M_value._30_2_;
  lVar19 = lVar17 - *(longdouble *)Vec->fStore->_M_value;
  lVar16 = lVar18 - *(longdouble *)(Vec->fStore->_M_value + 0x10);
  local_88 = SUB108(lVar19,0);
  uStack_80 = (undefined2)((unkuint10)lVar19 >> 0x40);
  local_78 = SUB108(lVar16,0);
  uStack_70 = (undefined2)((unkuint10)lVar16 >> 0x40);
  __z = Vec;
  lVar16 = in_ST2;
  lVar19 = in_ST2;
  lVar15 = in_ST2;
  lVar20 = in_ST2;
  local_48 = lVar18;
  local_3c = lVar17;
  std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)Vec);
  local_78 = tol._M_value._16_8_;
  uStack_70 = tol._M_value._24_2_;
  uVar8 = uStack_70;
  uStack_6e = tol._M_value._26_4_;
  uVar9 = uStack_6e;
  uStack_6a = tol._M_value._30_2_;
  uVar10 = uStack_6a;
  local_88 = tol._M_value._0_8_;
  uStack_80 = tol._M_value._8_2_;
  uVar5 = uStack_80;
  uStack_7e = tol._M_value._10_4_;
  uVar6 = uStack_7e;
  uStack_7a = tol._M_value._14_2_;
  uVar7 = uStack_7a;
  std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)__z);
  if (ABS(in_ST1) <= ABS(in_ST0)) {
    pcVar11 = Vec->fStore;
    diff0._M_value._10_6_ = val._M_value._10_6_;
    diff0._M_value._26_6_ = val._M_value._26_6_;
    lVar17 = lVar17 - *(longdouble *)pcVar11->_M_value;
    lVar18 = lVar18 - *(longdouble *)(pcVar11->_M_value + 0x10);
    diff0._M_value._0_8_ = SUB108(lVar17,0);
    diff0._M_value._8_2_ = SUB102((unkuint10)lVar17 >> 0x40,0);
    diff0._M_value._16_8_ = SUB108(lVar18,0);
    diff0._M_value._24_2_ = SUB102((unkuint10)lVar18 >> 0x40,0);
  }
  else {
    diff0._M_value._0_8_ = SUB108((longdouble)1e+10,0);
    diff0._M_value._8_2_ = SUB102((unkuint10)(longdouble)1e+10 >> 0x40,0);
    diff0._M_value._16_8_ = SUB108((longdouble)0,0);
    diff0._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
    pcVar11 = Vec->fStore;
  }
  uVar2 = *(undefined8 *)pcVar11->_M_value;
  uVar3 = *(undefined8 *)(pcVar11->_M_value + 8);
  uVar4 = *(undefined8 *)(pcVar11->_M_value + 0x18);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) =
       *(undefined8 *)(pcVar11->_M_value + 0x10);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar4;
  *(undefined8 *)__return_storage_ptr__->_M_value = uVar2;
  *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar3;
  lVar13 = 0;
  for (lVar12 = 1; lVar12 < Vec->fNElements; lVar12 = lVar12 + 1) {
    local_68._M_value._14_2_ = val._M_value._14_2_;
    local_68._M_value._10_4_ = val._M_value._10_4_;
    local_68._M_value._30_2_ = val._M_value._30_2_;
    local_68._M_value._26_4_ = val._M_value._26_4_;
    lVar18 = local_3c - *(longdouble *)(Vec->fStore[1]._M_value + lVar13);
    lVar17 = local_48 - *(longdouble *)(Vec->fStore[1]._M_value + lVar13 + 0x10);
    local_68._M_value._0_8_ = SUB108(lVar18,0);
    local_68._M_value._8_2_ = SUB102((unkuint10)lVar18 >> 0x40,0);
    local_68._M_value._16_8_ = SUB108(lVar17,0);
    local_68._M_value._24_2_ = SUB102((unkuint10)lVar17 >> 0x40,0);
    local_78 = local_68._M_value._16_8_;
    uStack_70 = local_68._M_value._24_2_;
    uStack_6e = val._M_value._26_4_;
    uStack_6a = val._M_value._30_2_;
    local_88 = local_68._M_value._0_8_;
    uStack_80 = local_68._M_value._8_2_;
    uStack_7e = val._M_value._10_4_;
    uStack_7a = val._M_value._14_2_;
    lVar17 = lVar20;
    lVar18 = lVar20;
    lVar21 = lVar20;
    std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)__z);
    lVar14 = ABS(in_ST2);
    local_78 = tol._M_value._16_8_;
    local_88 = tol._M_value._0_8_;
    in_ST2 = lVar19;
    lVar19 = lVar20;
    lVar20 = lVar18;
    uStack_80 = uVar5;
    uStack_7e = uVar6;
    uStack_7a = uVar7;
    uStack_70 = uVar8;
    uStack_6e = uVar9;
    uStack_6a = uVar10;
    std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)__z);
    lVar18 = ABS(lVar16);
    pcVar11 = &diff0;
    lVar16 = lVar15;
    if (lVar18 <= lVar14) {
      local_78 = local_68._M_value._16_8_;
      uStack_70 = local_68._M_value._24_2_;
      uStack_6e = local_68._M_value._26_4_;
      uStack_6a = local_68._M_value._30_2_;
      local_88 = local_68._M_value._0_8_;
      uStack_80 = local_68._M_value._8_2_;
      uStack_7e = local_68._M_value._10_4_;
      uStack_7a = local_68._M_value._14_2_;
      lVar16 = lVar17;
      lVar17 = lVar21;
      std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)__z);
      lVar18 = ABS(in_ST2);
      local_78 = diff0._M_value._16_8_;
      uStack_70 = diff0._M_value._24_2_;
      uStack_6e = diff0._M_value._26_4_;
      uStack_6a = diff0._M_value._30_2_;
      local_88 = diff0._M_value._0_8_;
      uStack_80 = diff0._M_value._8_2_;
      uStack_7e = diff0._M_value._10_4_;
      uStack_7a = diff0._M_value._14_2_;
      in_ST2 = lVar19;
      lVar19 = lVar20;
      lVar20 = lVar21;
      std::abs<long_double>((longdouble *)&local_88,(complex<long_double> *)__z);
      pcVar11 = &diff0;
      if (lVar18 < ABS(lVar15)) {
        puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar13);
        uVar2 = *puVar1;
        uVar3 = puVar1[1];
        puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar13 + 0x10);
        uVar4 = puVar1[1];
        *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = *puVar1;
        *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar4;
        *(undefined8 *)__return_storage_ptr__->_M_value = uVar2;
        *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar3;
        pcVar11 = &local_68;
      }
    }
    diff0._M_value._0_8_ = *(undefined8 *)pcVar11->_M_value;
    diff0._M_value._16_8_ = *(undefined8 *)(pcVar11->_M_value + 0x10);
    diff0._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar11->_M_value + 0x18),0);
    diff0._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar11->_M_value + 0x18) >> 0x10,0);
    diff0._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar11->_M_value + 8),0);
    diff0._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar11->_M_value + 8) >> 0x10,0);
    lVar13 = lVar13 + 0x20;
    lVar15 = lVar17;
  }
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}